

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void fill_nh_score_entry(toptenentry *in,nh_topten_entry *out,int rank,boolean highlight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int alignnum;
  int gendnum;
  int racenum;
  int rolenum;
  boolean highlight_local;
  int rank_local;
  nh_topten_entry *out_local;
  toptenentry *in_local;
  
  iVar1 = str2role(in->plrole);
  iVar2 = str2race(in->plrace);
  iVar3 = str2gend(in->plgend);
  iVar4 = str2align(in->plalign);
  if ((((iVar1 != -1) && (iVar2 != -1)) && (iVar3 != -1)) && (iVar4 != -1)) {
    out->rank = rank;
    out->points = in->points;
    out->maxlvl = in->maxlvl;
    out->hp = in->hp;
    out->maxhp = in->maxhp;
    out->deaths = in->deaths;
    out->ver_major = in->ver_major;
    out->ver_minor = in->ver_minor;
    out->patchlevel = in->patchlevel;
    out->highlight = highlight;
    out->moves = in->moves;
    out->end_how = in->how;
    strncpy(out->name,in->name,0xf);
    strncpy(out->death,in->death,99);
    if ((iVar3 == 1) && (roles[iVar1].name.f != (char *)0x0)) {
      strncpy(out->plrole,roles[iVar1].name.f,0x10);
    }
    else {
      strncpy(out->plrole,roles[iVar1].name.m,0x10);
    }
    strncpy(out->plrace,races[iVar2].noun,0x10);
    strncpy(out->plgend,genders[iVar3].adj,0x10);
    strncpy(out->plalign,aligns[iVar4].adj,0x10);
    topten_death_description(in,out->entrytxt);
  }
  return;
}

Assistant:

static void fill_nh_score_entry(struct toptenentry *in, struct nh_topten_entry *out,
				int rank, boolean highlight)
{
    
    int rolenum = str2role(in->plrole);
    int racenum = str2race(in->plrace);
    int gendnum = str2gend(in->plgend);
    int alignnum = str2align(in->plalign);
    
    if (rolenum == ROLE_NONE || racenum == ROLE_NONE ||
	gendnum == ROLE_NONE || alignnum == ROLE_NONE)
	return;
    
    out->rank = rank;
    out->points = in->points;
    out->maxlvl = in->maxlvl;
    out->hp = in->hp;
    out->maxhp = in->maxhp;
    out->deaths = in->deaths;
    out->ver_major = in->ver_major;
    out->ver_minor = in->ver_minor;
    out->patchlevel = in->patchlevel;
    out->highlight = highlight;
    out->moves = in->moves;
    out->end_how = in->how;
    
    strncpy(out->name, in->name, NAMSZ);
    strncpy(out->death, in->death, DTHSZ);
    
    if (gendnum == 1 && roles[rolenum].name.f)
	strncpy(out->plrole, roles[rolenum].name.f, PLRBUFSZ);
    else
	strncpy(out->plrole, roles[rolenum].name.m, PLRBUFSZ);
    
    strncpy(out->plrace, races[racenum].noun, PLRBUFSZ);
    strncpy(out->plgend, genders[gendnum].adj, PLRBUFSZ);
    strncpy(out->plalign, aligns[alignnum].adj, PLRBUFSZ);
    
    topten_death_description(in, out->entrytxt);
}